

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O2

int exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
               top_actions_first,
              __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
              top_actions_last,long param_3,long param_4)

{
  long lVar1;
  double dVar2;
  
  if (*(ulong *)(param_4 + 8) <= *(ulong *)(param_3 + 8)) {
    return 1;
  }
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    (top_actions_first,top_actions_last,0.0);
  if ((float)dVar2 <= 1e-06) {
    *(undefined4 *)(*(long *)(param_3 + 8) + 4) = 0x3f800000;
    lVar1 = *(long *)(param_3 + 8);
    while (lVar1 + 8 != *(long *)(param_4 + 8)) {
      *(undefined4 *)(lVar1 + 0xc) = 0;
      lVar1 = lVar1 + 8;
    }
  }
  else {
    lVar1 = *(long *)(param_3 + 8);
    for (; (lVar1 != *(long *)(param_4 + 8) &&
           (top_actions_first._M_current != top_actions_last._M_current));
        top_actions_first._M_current = top_actions_first._M_current + 1) {
      *(float *)(lVar1 + 4) = *top_actions_first._M_current * (1.0 / (float)dVar2);
      lVar1 = lVar1 + 8;
    }
  }
  return 0;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }